

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_impl.h
# Opt level: O3

pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> __thiscall
google::protobuf::internal::SerialArena::AllocateAlignedWithCleanup
          (SerialArena *this,size_t n,AllocationPolicy *policy)

{
  char *pcVar1;
  void *ret;
  LogMessage *other;
  CleanupNode *pCVar2;
  pair<void_*,_google::protobuf::internal::SerialArena::CleanupNode_*> pVar3;
  LogFinisher local_59;
  LogMessage local_58;
  
  if ((n + 7 & 0xfffffffffffffff8) != n) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/arena_impl.h"
               ,0xf4);
    other = LogMessage::operator<<(&local_58,"CHECK failed: (internal::AlignUpTo8(n)) == (n): ");
    LogFinisher::operator=(&local_59,other);
    LogMessage::~LogMessage(&local_58);
  }
  pcVar1 = this->ptr_;
  if ((ulong)((long)this->limit_ - (long)pcVar1) < n + 0x10) {
    pVar3 = AllocateAlignedWithCleanupFallback(this,n,policy);
  }
  else {
    this->ptr_ = pcVar1 + n;
    pCVar2 = (CleanupNode *)(this->limit_ + -0x10);
    pVar3.second = pCVar2;
    pVar3.first = pcVar1;
    this->limit_ = (char *)pCVar2;
  }
  return pVar3;
}

Assistant:

std::pair<void*, CleanupNode*> AllocateAlignedWithCleanup(
      size_t n, const AllocationPolicy* policy) {
    GOOGLE_DCHECK_EQ(internal::AlignUpTo8(n), n);  // Must be already aligned.
    if (PROTOBUF_PREDICT_FALSE(!HasSpace(n + kCleanupSize))) {
      return AllocateAlignedWithCleanupFallback(n, policy);
    }
    return AllocateFromExistingWithCleanupFallback(n);
  }